

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void share_listen_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  undefined4 in_register_00000034;
  
  if (type != PLUGCLOSE_NORMAL) {
    log_general((ssh_sharing_state *)(plug + -6),(char *)CONCAT44(in_register_00000034,type));
  }
  (**(code **)((plug[-5].vt)->log + 8))();
  plug[-5].vt = (PlugVtable *)0x0;
  return;
}

Assistant:

static void share_listen_closing(Plug *plug, PlugCloseType type,
                                 const char *error_msg)
{
    ssh_sharing_state *sharestate =
        container_of(plug, ssh_sharing_state, plug);
    if (type != PLUGCLOSE_NORMAL)
        log_general(sharestate, "listening socket: %s", error_msg);
    sk_close(sharestate->listensock);
    sharestate->listensock = NULL;
}